

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue_basic_tests.cpp
# Opt level: O2

void density_tests::
     heterogeneous_queue_basic_void_tests<density::heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>>
               (void)

{
  bool bVar1;
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  queue;
  iterator local_28;
  
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::heter_queue(&queue);
  bVar1 = density::
          heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                   *)&queue);
  if (!bVar1) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x4f);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::begin(&local_28,&queue);
  if (CONCAT44(local_28.m_control._4_4_,local_28.m_control._0_4_) != 0) {
    detail::assert_failed<>
              ("queue.begin() == queue.end()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x50);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::cbegin((const_iterator *)&local_28,&queue);
  if (CONCAT44(local_28.m_control._4_4_,local_28.m_control._0_4_) != 0) {
    detail::assert_failed<>
              ("queue.cbegin() == queue.cend()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x51);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::~heter_queue(&queue);
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::heter_queue(&queue);
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::clear(&queue);
  local_28.m_control._0_4_ = 1;
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>
  ::emplace<int,int>((heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>
                      *)&queue,(int *)&local_28);
  bVar1 = density::
          heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                   *)&queue);
  if (bVar1) {
    detail::assert_failed<>
              ("!queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x59);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::begin(&local_28,&queue);
  if (CONCAT44(local_28.m_control._4_4_,local_28.m_control._0_4_) == 0) {
    detail::assert_failed<>
              ("queue.begin() != queue.end()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x5a);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::cbegin((const_iterator *)&local_28,&queue);
  if (CONCAT44(local_28.m_control._4_4_,local_28.m_control._0_4_) == 0) {
    detail::assert_failed<>
              ("queue.cbegin() != queue.cend()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x5b);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::clear(&queue);
  bVar1 = density::
          heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                   *)&queue);
  if (!bVar1) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x5e);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::begin(&local_28,&queue);
  if (CONCAT44(local_28.m_control._4_4_,local_28.m_control._0_4_) != 0) {
    detail::assert_failed<>
              ("queue.begin() == queue.end()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x5f);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::cbegin((const_iterator *)&local_28,&queue);
  if (CONCAT44(local_28.m_control._4_4_,local_28.m_control._0_4_) != 0) {
    detail::assert_failed<>
              ("queue.cbegin() == queue.cend()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x60);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::clear(&queue);
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::~heter_queue(&queue);
  return;
}

Assistant:

void heterogeneous_queue_basic_void_tests()
    {
        {
            QUEUE queue;
            DENSITY_TEST_ASSERT(queue.empty());
            DENSITY_TEST_ASSERT(queue.begin() == queue.end());
            DENSITY_TEST_ASSERT(queue.cbegin() == queue.cend());
        }

        {
            QUEUE queue;
            queue.clear();

            queue.push(1);
            DENSITY_TEST_ASSERT(!queue.empty());
            DENSITY_TEST_ASSERT(queue.begin() != queue.end());
            DENSITY_TEST_ASSERT(queue.cbegin() != queue.cend());

            queue.clear();
            DENSITY_TEST_ASSERT(queue.empty());
            DENSITY_TEST_ASSERT(queue.begin() == queue.end());
            DENSITY_TEST_ASSERT(queue.cbegin() == queue.cend());
            queue.clear();
        }
    }